

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O0

void __thiscall
TPZGradientReconstruction::TPZGradientData::ComputeWeights(TPZGradientData *this,REAL paramk)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  TPZManVector<double,_3> *this_00;
  double *pdVar3;
  long lVar4;
  long in_RDI;
  double in_XMM0_Qa;
  REAL RVar5;
  double dVar6;
  int id;
  REAL temp;
  int k;
  TPZGeoEl *gel;
  int in;
  REAL sum;
  TPZManVector<double,_3> centerneigh;
  TPZManVector<double,_30> dist;
  int64_t nneighs;
  TPZManVector<double,_3> nodecelX;
  TPZManVector<double,_30> *in_stack_fffffffffffffd70;
  TPZCompEl *in_stack_fffffffffffffd78;
  TPZVec<double> *in_stack_fffffffffffffd88;
  TPZManVector<double,_3> *in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  TPZManVector<double,_30> *in_stack_fffffffffffffda0;
  TPZManVector<double,_3> *in_stack_fffffffffffffdb0;
  int local_1ec;
  int local_1d4;
  int local_1c4;
  double local_1c0;
  TPZVec<double> local_1b0;
  undefined8 local_178;
  TPZVec<double> local_170 [4];
  TPZManVector<double,_3> *in_stack_ffffffffffffff28;
  TPZGradientData *in_stack_ffffffffffffff30;
  
  if ((in_XMM0_Qa < 1.0) || (2.0 < in_XMM0_Qa)) {
    pzinternal::DebugStopImpl((char *)dist.fExtAlloc[9],(size_t)dist.fExtAlloc[8]);
  }
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88);
  NodeCloserCenterX(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = TPZVec<TPZCompEl_*>::size((TPZVec<TPZCompEl_*> *)(in_RDI + 0x568));
  local_178 = 0;
  TPZManVector<double,_30>::TPZManVector
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(double *)in_stack_fffffffffffffd90
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (double *)in_stack_fffffffffffffd90);
  local_1c0 = 0.0;
  for (local_1c4 = 0; (long)local_1c4 < iVar1 + -1; local_1c4 = local_1c4 + 1) {
    TPZVec<TPZCompEl_*>::operator[]((TPZVec<TPZCompEl_*> *)(in_RDI + 0x568),(long)(local_1c4 + 1));
    pTVar2 = TPZCompEl::Reference(in_stack_fffffffffffffd78);
    if (pTVar2 == (TPZGeoEl *)0x0) {
      pzinternal::DebugStopImpl((char *)dist.fExtAlloc[9],(size_t)dist.fExtAlloc[8]);
    }
    for (local_1d4 = 0; local_1d4 < *(int *)(in_RDI + 0x560); local_1d4 = local_1d4 + 1) {
      this_00 = TPZVec<TPZManVector<double,_3>_>::operator[]
                          ((TPZVec<TPZManVector<double,_3>_> *)(in_RDI + 0x80),(long)(local_1c4 + 1)
                          );
      pdVar3 = TPZVec<double>::operator[](&this_00->super_TPZVec<double>,(long)local_1d4);
      dVar6 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_1b0,(long)local_1d4);
      *pdVar3 = dVar6;
    }
    RVar5 = TPZGeoEl::Distance(&in_stack_fffffffffffffd90->super_TPZVec<double>,
                               in_stack_fffffffffffffd88);
    pdVar3 = TPZVec<double>::operator[](local_170,(long)local_1c4);
    *pdVar3 = RVar5;
    in_stack_fffffffffffffdb0 =
         (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_170,(long)local_1c4);
    dVar6 = pow((double)(in_stack_fffffffffffffdb0->super_TPZVec<double>)._vptr_TPZVec,in_XMM0_Qa);
    local_1c0 = 1.0 / dVar6 + local_1c0;
  }
  pdVar3 = (double *)(in_RDI + 0x5d8);
  iVar1 = TPZVec<double>::size(local_170);
  TPZManVector<double,_3>::Resize(in_stack_fffffffffffffdb0,iVar1,pdVar3);
  local_1ec = 0;
  do {
    lVar4 = (long)local_1ec;
    iVar1 = TPZVec<double>::size(local_170);
    if (iVar1 <= lVar4) {
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
      TPZManVector<double,_30>::~TPZManVector(in_stack_fffffffffffffd70);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
      return;
    }
    pdVar3 = TPZVec<double>::operator[](local_170,(long)local_1ec);
    dVar6 = pow(*pdVar3,in_XMM0_Qa);
    dVar6 = (1.0 / dVar6) / local_1c0;
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x5d8),(long)local_1ec);
    *pdVar3 = dVar6;
    in_stack_fffffffffffffd70 =
         (TPZManVector<double,_30> *)
         TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x5d8),(long)local_1ec);
    if ((double)(in_stack_fffffffffffffd70->super_TPZVec<double>)._vptr_TPZVec <= 0.0 &&
        (double)(in_stack_fffffffffffffd70->super_TPZVec<double>)._vptr_TPZVec != 0.0) {
LAB_01c97182:
      pzinternal::DebugStopImpl((char *)dist.fExtAlloc[9],(size_t)dist.fExtAlloc[8]);
    }
    else {
      pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x5d8),(long)local_1ec);
      if (1.0 < *pdVar3) goto LAB_01c97182;
    }
    local_1ec = local_1ec + 1;
  } while( true );
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::ComputeWeights(REAL paramk)
{
    
    if(paramk<1 || paramk>2) DebugStop();
    
    TPZManVector<REAL,3> nodecelX;
    
    //Node more closer of the cel barycenter
    NodeCloserCenterX(nodecelX);
    
    int64_t nneighs = fCelAndNeighbors.size()-1;
    TPZManVector<REAL,30> dist(nneighs,0.);
    TPZManVector<REAL,3> centerneigh(3,0.0);
    
    REAL sum=0.;
    for(int in = 0; in < nneighs; in++)
    {
        TPZGeoEl * gel = fCelAndNeighbors[in+1]->Reference();
        if(!gel) DebugStop();
        
        for(int k=0; k<fdim; k++) centerneigh[k]=fCenterPointCellAndNeighbors[in+1][k];
        
        dist[in]=gel->Distance(centerneigh, nodecelX);
        
        sum += 1./pow((REAL)dist[in],paramk);
    }
    
    fWeightsGrad.Resize(dist.size(), 0.);
    REAL temp;
    
    for (int id = 0; id<dist.size(); id++)
    {
        temp = 1./pow((REAL)dist[id],paramk);
        fWeightsGrad[id] = temp/sum;
        if(fWeightsGrad[id]<0 || fWeightsGrad[id]>1) DebugStop();
    }
}